

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_indexer.hpp
# Opt level: O0

void set_reference_points<float,unsigned_long>
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
               bool with_distances,float *numeric_data,int *categ_data,bool is_col_major,
               size_t ld_numeric,size_t ld_categ,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,float *Xr,unsigned_long *Xr_ind,unsigned_long *Xr_indptr,
               size_t nrows,int nthreads)

{
  byte in_CL;
  long in_RDI;
  byte in_stack_00000008;
  bool in_stack_0000004f;
  int *in_stack_00000050;
  undefined4 in_stack_00000058;
  undefined4 in_stack_0000005c;
  bool in_stack_00000067;
  ExtIsoForest *in_stack_00000068;
  TreesIndexer *in_stack_00000070;
  SingleTreeIndex *tree;
  iterator __end2;
  iterator __begin2;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  undefined7 in_stack_000000b0;
  undefined7 in_stack_000000c8;
  unsigned_long *in_stack_000000e8;
  size_t in_stack_000000f0;
  int in_stack_000000f8;
  undefined1 local_118 [80];
  undefined1 *local_c8;
  undefined1 *local_b0;
  byte local_61;
  byte local_49;
  
  local_b0 = local_118;
  local_c8 = local_118;
  local_49 = in_CL & 1;
  local_61 = in_stack_00000008 & 1;
  if (in_RDI == 0) {
    set_reference_points<ExtIsoForest,float,unsigned_long>
              (in_stack_00000070,in_stack_00000068,in_stack_00000067,
               (float *)CONCAT44(in_stack_0000005c,in_stack_00000058),in_stack_00000050,
               in_stack_0000004f,CONCAT17(is_col_major,in_stack_000000b0),(size_t)categ_data,
               numeric_data,(unsigned_long *)CONCAT17(with_distances,in_stack_000000c8),
               (unsigned_long *)indexer,(float *)model_outputs_ext,(unsigned_long *)model_outputs,
               in_stack_000000e8,in_stack_000000f0,in_stack_000000f8);
  }
  else {
    set_reference_points<IsoForest,float,unsigned_long>
              (in_stack_00000070,(IsoForest *)in_stack_00000068,in_stack_00000067,
               (float *)CONCAT44(in_stack_0000005c,in_stack_00000058),in_stack_00000050,
               in_stack_0000004f,CONCAT17(is_col_major,in_stack_000000b0),(size_t)categ_data,
               numeric_data,(unsigned_long *)CONCAT17(with_distances,in_stack_000000c8),
               (unsigned_long *)indexer,(float *)model_outputs_ext,(unsigned_long *)model_outputs,
               in_stack_000000e8,in_stack_000000f0,in_stack_000000f8);
  }
  return;
}

Assistant:

void set_reference_points(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext, TreesIndexer *indexer,
                          const bool with_distances,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                          size_t nrows, int nthreads)
{
    try
    {
        if (model_outputs != NULL)
            set_reference_points(*indexer, *model_outputs, with_distances,
                                 numeric_data, categ_data,
                                 is_col_major, ld_numeric, ld_categ,
                                 Xc, Xc_ind, Xc_indptr,
                                 Xr, Xr_ind, Xr_indptr,
                                 nrows, nthreads);
        else
            set_reference_points(*indexer, *model_outputs_ext, with_distances,
                                 numeric_data, categ_data,
                                 is_col_major, ld_numeric, ld_categ,
                                 Xc, Xc_ind, Xc_indptr,
                                 Xr, Xr_ind, Xr_indptr,
                                 nrows, nthreads);
    }

    catch (...)
    {
        for (auto &tree : indexer->indices)
        {
            tree.reference_points.clear();
            tree.reference_indptr.clear();
            tree.reference_mapping.clear();
        }

        throw;
    }
}